

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# LowerMDShared.cpp
# Opt level: O2

void LowererMD::ChangeToIMul(Instr *instr,bool hasOverflowCheck)

{
  code *pcVar1;
  bool bVar2;
  RegNum RVar3;
  RegOpnd *dstOpnd;
  Instr *pIVar4;
  RegOpnd *dstOpnd_00;
  AddrOpnd *pAVar5;
  int64 value;
  IntConstOpnd *src1Opnd;
  Opnd *pOVar6;
  undefined4 *puVar7;
  undefined8 uVar8;
  undefined7 in_register_00000031;
  byte bVar9;
  
  if ((int)CONCAT71(in_register_00000031,hasOverflowCheck) == 0) {
LAB_005d6a94:
    EmitInt4Instr(instr);
    return;
  }
  bVar2 = IR::Instr::ShouldCheckFor32BitOverflow(instr);
  if (bVar2) goto LAB_005d6a94;
  bVar2 = IR::Instr::ShouldCheckForNon32BitOverflow(instr);
  if (!bVar2) goto LAB_005d6a94;
  dstOpnd = IR::RegOpnd::New(TyInt32,instr->m_func);
  RVar3 = LowererMDArch::GetRegIMulDestLower();
  dstOpnd->m_reg = RVar3;
  pIVar4 = IR::Instr::New(MOV,&dstOpnd->super_Opnd,instr->m_src1,instr->m_func);
  IR::Instr::InsertBefore(instr,pIVar4);
  bVar2 = IR::Opnd::IsImmediateOpnd(instr->m_src2);
  if (!bVar2) {
    dstOpnd_00 = (RegOpnd *)0x0;
    goto LAB_005d6b0f;
  }
  dstOpnd_00 = IR::RegOpnd::New(TyInt32,instr->m_func);
  pOVar6 = instr->m_src2;
  bVar2 = IR::Opnd::IsHelperCallOpnd(pOVar6);
  bVar9 = 1;
  if (!bVar2) {
    bVar2 = IR::Opnd::IsIntConstOpnd(pOVar6);
    if (!bVar2) {
      bVar2 = IR::Opnd::IsAddrOpnd(pOVar6);
      if (!bVar2) {
        bVar2 = IR::Opnd::IsInt64ConstOpnd(pOVar6);
        if (!bVar2) {
          AssertCount = AssertCount + 1;
          Js::Throw::LogAssert();
          puVar7 = (undefined4 *)__tls_get_addr(&PTR_013e5f18);
          *puVar7 = 1;
          bVar2 = Js::Throw::ReportAssert
                            ("/workspace/llm4binary/github/license_c_cmakelists/chakra-core[P]ChakraCore/lib/Backend/LowerMDShared.cpp"
                             ,0x55c,"(false)","Unexpected immediate opnd");
          if (bVar2) {
            *puVar7 = 0;
            uVar8 = __cxa_allocate_exception(1);
            __cxa_throw(uVar8,&Js::OperationAbortedException::typeinfo,0);
          }
          pcVar1 = (code *)invalidInstructionException();
          (*pcVar1)();
        }
        bVar9 = 0;
        goto LAB_005d6acd;
      }
    }
    bVar2 = IR::Opnd::IsIntConstOpnd(pOVar6);
    if (bVar2) {
      pAVar5 = (AddrOpnd *)IR::Opnd::AsIntConstOpnd(pOVar6);
    }
    else {
      pAVar5 = IR::Opnd::AsAddrOpnd(pOVar6);
    }
    bVar9 = pAVar5->field_0x28;
  }
LAB_005d6acd:
  value = IR::Opnd::GetImmediateValue(instr->m_src2,instr->m_func);
  src1Opnd = IR::IntConstOpnd::New(value,TyInt32,instr->m_func,(bool)(bVar9 & 1));
  pIVar4 = IR::Instr::New(MOV,&dstOpnd_00->super_Opnd,&src1Opnd->super_Opnd,instr->m_func);
  IR::Instr::InsertBefore(instr,pIVar4);
LAB_005d6b0f:
  instr->m_opcode = IMUL;
  IR::Instr::ReplaceSrc1(instr,&dstOpnd->super_Opnd);
  if (dstOpnd_00 != (RegOpnd *)0x0) {
    IR::Instr::ReplaceSrc2(instr,&dstOpnd_00->super_Opnd);
  }
  pOVar6 = IR::Opnd::Copy(instr->m_dst,instr->m_func);
  IR::Instr::ReplaceDst(instr,&dstOpnd->super_Opnd);
  pIVar4 = IR::Instr::New(MOV,pOVar6,&dstOpnd->super_Opnd,instr->m_func);
  IR::Instr::InsertAfter(instr,pIVar4);
  return;
}

Assistant:

void LowererMD::ChangeToIMul(IR::Instr *const instr, bool hasOverflowCheck)
{
    // If non-32 bit overflow check is needed, we have to use the IMUL form.
    if (hasOverflowCheck && !instr->ShouldCheckFor32BitOverflow() && instr->ShouldCheckForNon32BitOverflow())
    {
        IR::RegOpnd *regEAX = IR::RegOpnd::New(TyInt32, instr->m_func);
        IR::Opnd *temp2 = nullptr;
        // MOV eax, src1
        regEAX->SetReg(LowererMDArch::GetRegIMulDestLower());
        instr->InsertBefore(IR::Instr::New(Js::OpCode::MOV, regEAX, instr->GetSrc1(), instr->m_func));

        if (instr->GetSrc2()->IsImmediateOpnd())
        {
            // MOV reg, imm
            temp2 = IR::RegOpnd::New(TyInt32, instr->m_func);

            IR::Opnd * src2 = instr->GetSrc2();
            bool dontEncode = false;
            if (src2->IsHelperCallOpnd())
            {
                dontEncode = true;
            }
            else if (src2->IsIntConstOpnd() || src2->IsAddrOpnd())
            {
                dontEncode = src2->IsIntConstOpnd() ? src2->AsIntConstOpnd()->m_dontEncode : src2->AsAddrOpnd()->m_dontEncode;
            }
            else if (src2->IsInt64ConstOpnd())
            {
                dontEncode = false;
            }
            else
            {
                AssertMsg(false, "Unexpected immediate opnd");
                throw Js::OperationAbortedException();
            }

            instr->InsertBefore(IR::Instr::New(Js::OpCode::MOV, temp2,
                IR::IntConstOpnd::New((IntConstType)instr->GetSrc2()->GetImmediateValue(instr->m_func), TyInt32, instr->m_func, dontEncode),
                instr->m_func));
        }
        // eax = IMUL eax, reg
        instr->m_opcode = Js::OpCode::IMUL;
        instr->ReplaceSrc1(regEAX);

        if (temp2 != nullptr)
            instr->ReplaceSrc2(temp2);

        auto *dst = instr->GetDst()->Copy(instr->m_func);
        instr->ReplaceDst(regEAX);

        // MOV dst, eax
        instr->InsertAfter(IR::Instr::New(Js::OpCode::MOV, dst, regEAX, instr->m_func));
    }
    else
        EmitInt4Instr(instr); // IMUL2
}